

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O3

void simple_epollin_impl(_func_void_int_ptr *fd_fun)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  uint8_t data;
  int fds [3];
  epoll_event event_result;
  epoll_event event;
  undefined1 local_3d;
  int local_3c;
  int local_38;
  int local_34;
  epoll_event local_30;
  int local_20;
  
  iVar1 = epoll_create1(0x80000);
  if (iVar1 < 0) {
    pcVar3 = "ep >= 0";
    uVar4 = 0x1a0;
  }
  else {
    (*fd_fun)(&local_3c);
    local_30.data.u64._4_4_ = 1;
    local_20 = local_3c;
    iVar2 = epoll_ctl(iVar1,1,local_3c,(epoll_event *)((long)&local_30.data + 4));
    if (iVar2 < 0) {
      pcVar3 = "epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) >= 0";
      uVar4 = 0x1a9;
    }
    else {
      local_3d = 0;
      write(local_38,&local_3d,1);
      iVar2 = epoll_wait(iVar1,&local_30,1,-1);
      if (iVar2 == 1) {
        if (local_30._4_4_ == local_3c) {
          iVar2 = close(local_30._4_4_);
          if (iVar2 == 0) {
            iVar2 = close(local_38);
            if (iVar2 == 0) {
              if (local_34 != -1) {
                iVar2 = close(local_34);
                if (iVar2 != 0) {
                  pcVar3 = "fds[2] == -1 || close(fds[2]) == 0";
                  uVar4 = 0x1b5;
                  goto LAB_0010464d;
                }
              }
              iVar1 = close(iVar1);
              if (iVar1 == 0) {
                return;
              }
              pcVar3 = "close(ep) == 0";
              uVar4 = 0x1b6;
            }
            else {
              pcVar3 = "close(fds[1]) == 0";
              uVar4 = 0x1b4;
            }
          }
          else {
            pcVar3 = "close(fds[0]) == 0";
            uVar4 = 0x1b3;
          }
        }
        else {
          pcVar3 = "event_result.data.fd == fds[0]";
          uVar4 = 0x1b1;
        }
      }
      else {
        pcVar3 = "epoll_wait(ep, &event_result, 1, -1) == 1";
        uVar4 = 0x1af;
      }
    }
  }
LAB_0010464d:
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
             ,uVar4,pcVar3);
}

Assistant:

static void
simple_epollin_impl(void (*fd_fun)(int fds[3]))
{
	int ep = epoll_create1(EPOLL_CLOEXEC);
	ATF_REQUIRE(ep >= 0);

	int fds[3];
	fd_fun(fds);

	struct epoll_event event;
	event.events = EPOLLIN;
	event.data.fd = fds[0];

	ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) >= 0);

	uint8_t data = '\0';
	write(fds[1], &data, 1);

	struct epoll_event event_result;
	ATF_REQUIRE(epoll_wait(ep, &event_result, 1, -1) == 1);

	ATF_REQUIRE(event_result.data.fd == fds[0]);

	ATF_REQUIRE(close(fds[0]) == 0);
	ATF_REQUIRE(close(fds[1]) == 0);
	ATF_REQUIRE(fds[2] == -1 || close(fds[2]) == 0);
	ATF_REQUIRE(close(ep) == 0);
}